

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase321::run(TestCase321 *this)

{
  Builder builder_00;
  Reader reader_00;
  size_t sVar1;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ReaderOptions options;
  TestPipe pipe;
  size_t local_2a0;
  Builder local_298;
  Reader local_270;
  TestMessageBuilder builder;
  PackedMessageReader reader;
  
  TestMessageBuilder::TestMessageBuilder(&builder,10);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_298,(MessageBuilder *)&builder);
  builder_00._builder.capTable = local_298._builder.capTable;
  builder_00._builder.segment = local_298._builder.segment;
  builder_00._builder.data = local_298._builder.data;
  builder_00._builder.pointers = local_298._builder.pointers;
  builder_00._builder.dataSize = local_298._builder.dataSize;
  builder_00._builder.pointerCount = local_298._builder.pointerCount;
  builder_00._builder._38_2_ = local_298._builder._38_2_;
  initTestMessage(builder_00);
  pipe.super_BufferedInputStream.super_InputStream._vptr_InputStream =
       (InputStream)&PTR__TestPipe_00393a70;
  pipe.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__TestPipe_00393ab0;
  pipe.preferredReadSize = 0xffffffffffffffff;
  pipe.data._M_dataplus._M_p = (pointer)&pipe.data.field_2;
  pipe.data._M_string_length = 0;
  pipe.data.field_2._M_local_buf[0] = '\0';
  pipe.readPos = 0;
  writePackedMessage(&pipe.super_OutputStream,(MessageBuilder *)&builder);
  sVar1 = computeSerializedSizeInWords((MessageBuilder *)&builder);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = (uchar *)pipe.data._M_string_length;
  sVar2 = computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes);
  if ((sVar1 != sVar2) && (kj::_::Debug::minSeverity < 3)) {
    reader.super_PackedInputStream.super_InputStream._vptr_InputStream =
         (_func_int **)computeSerializedSizeInWords((MessageBuilder *)&builder);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = (uchar *)pipe.data._M_string_length;
    local_2a0 = computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes_00);
    kj::_::Debug::log<char_const(&)[106],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x148,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(unsigned_long *)&reader,&local_2a0);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  PackedMessageReader::PackedMessageReader
            (&reader,&pipe.super_BufferedInputStream,options,(ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_270,&reader.super_InputStreamMessageReader.super_MessageReader);
  reader_00._reader.capTable = local_270._reader.capTable;
  reader_00._reader.segment = local_270._reader.segment;
  reader_00._reader.data = local_270._reader.data;
  reader_00._reader.pointers = local_270._reader.pointers;
  reader_00._reader.dataSize = local_270._reader.dataSize;
  reader_00._reader.pointerCount = local_270._reader.pointerCount;
  reader_00._reader._38_2_ = local_270._reader._38_2_;
  reader_00._reader.nestingLimit = local_270._reader.nestingLimit;
  reader_00._reader._44_4_ = local_270._reader._44_4_;
  checkTestMessage(reader_00);
  PackedMessageReader::~PackedMessageReader(&reader);
  TestPipe::~TestPipe(&pipe);
  TestMessageBuilder::~TestMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, ListAnyPointer) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56});
  EXPECT_TRUE(root.hasAnyPointerField());

  Orphan<List<uint32_t>> orphan = root.getAnyPointerField().disownAs<List<uint32_t>>();
  EXPECT_FALSE(orphan == nullptr);

  checkList(orphan.getReader(), {12u, 34u, 56u});
  EXPECT_FALSE(root.hasAnyPointerField());

  root.getAnyPointerField().adopt(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasAnyPointerField());
  checkList(root.asReader().getAnyPointerField().getAs<List<uint32_t>>(), {12u, 34u, 56u});
}